

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O3

void osThread::Initialize(void)

{
  long lVar1;
  
  builtin_strncpy(MainThread.Name,"main",5);
  lVar1 = 0;
  pthread_key_create(&tlsKey,(__destr_function *)0x0);
  do {
    if (*(long *)((long)Threads + lVar1) == 0) {
      *(osThread **)((long)Threads + lVar1) = &MainThread;
      IsInitialized = 1;
      return;
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x180);
  IsInitialized = 1;
  return;
}

Assistant:

void osThread::Initialize()
{
    // This is a hack to add the thread that called main() to the list
    snprintf(MainThread.Name, NAME_LENGTH_MAX, "main");
#ifdef _WIN32
    if ((dwTlsIndex = TlsAlloc()) == TLS_OUT_OF_INDEXES)
    {
        // ErrorExit( "TlsAlloc failed" );
    }
    TlsSetValue(dwTlsIndex, &MainThread);
#elif __linux__
    pthread_key_create(&tlsKey, nullptr);
#endif
    for (int i = 0; i < MAX_THREADS; i++)
    {
        if (Threads[i] == nullptr)
        {
            Threads[i] = &MainThread;
            break;
        }
    }
    IsInitialized = true;
}